

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

string * __thiscall FIX::Message::toXML(Message *this,string *str)

{
  char cVar1;
  ostream *poVar2;
  string *psVar3;
  stringstream stream;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"<message>",9);
  cVar1 = (char)(ostream *)local_190;
  std::ios::widen((char)*(undefined8 *)(local_190[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  poVar2 = (ostream *)std::ostream::flush();
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<header>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  toXMLFields_abi_cxx11_(&local_200,this,&(this->m_header).super_FieldMap,4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_200._M_dataplus._M_p,local_200._M_string_length);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</header>",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<body>",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  toXMLFields_abi_cxx11_(&local_1c0,this,&this->super_FieldMap,4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</body>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<trailer>",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  toXMLFields_abi_cxx11_(&local_1e0,this,&(this->m_trailer).super_FieldMap,4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</trailer>",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</message>",10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  psVar3 = (string *)std::__cxx11::string::operator=((string *)str,(string *)&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return psVar3;
}

Assistant:

std::string& Message::toXML( std::string& str ) const
{
  std::stringstream stream;
  stream << "<message>"                         << std::endl
         << std::setw(2) << " " << "<header>"   << std::endl
         << toXMLFields(getHeader(), 4)
         << std::setw(2) << " " << "</header>"  << std::endl
         << std::setw(2) << " " << "<body>"     << std::endl
         << toXMLFields(*this, 4)
         << std::setw(2) << " " << "</body>"    << std::endl
         << std::setw(2) << " " << "<trailer>"  << std::endl
         << toXMLFields(getTrailer(), 4)
         << std::setw(2) << " " << "</trailer>" << std::endl
         << "</message>";

  return str = stream.str();
}